

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkdetheme.cpp
# Opt level: O0

QPlatformTheme * QKdeTheme::createKdeTheme(void)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  long in_FS_OFFSET;
  int kdeVersion;
  char16_t *str;
  char16_t *str_1;
  QString kdeVersionPrefix;
  QSettings kdeSettings;
  QString kdeRcPath;
  QString kdeHomePath;
  QString kdeVersionHomePath;
  QString kdeDirsVar;
  QString kdeHomePathVar;
  QStringList kdeDirs;
  QByteArray kdeVersionBA;
  undefined4 in_stack_fffffffffffffbe8;
  SplitBehaviorFlags in_stack_fffffffffffffbec;
  QStringBuilder<QLatin1String,_QLatin1String> *in_stack_fffffffffffffbf0;
  QStringBuilder<QString,_QLatin1String> *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc04;
  undefined1 in_stack_fffffffffffffc05;
  undefined1 in_stack_fffffffffffffc06;
  undefined1 in_stack_fffffffffffffc07;
  QPlatformTheme *local_3e8;
  char local_3b0 [32];
  QFileInfo local_390 [24];
  QLatin1StringView local_378;
  undefined1 *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  QArrayDataPointer<char16_t> local_330 [3];
  QArrayDataPointer<char16_t> local_2d8 [2];
  undefined1 *local_298;
  undefined1 *local_290;
  QFileInfo local_288 [8];
  QLatin1StringView local_280;
  QLatin1StringView local_260;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  QFileInfo local_1e8 [8];
  QLatin1StringView local_1e0;
  undefined1 *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  QFileInfo local_178 [24];
  QLatin1StringView local_160;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  QChar local_ba;
  undefined1 local_b8 [24];
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 local_58 [24];
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_40);
  iVar6 = QByteArray::toInt((bool *)&local_40,0);
  if (iVar6 < 4) {
    local_3e8 = (QPlatformTheme *)0x0;
  }
  else if (iVar6 < 5) {
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::QList((QList<QString> *)0xadefa0);
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    qEnvironmentVariable((char *)&local_88);
    bVar1 = QString::isEmpty((QString *)0xadefee);
    if (!bVar1) {
      QList<QString>::operator+=
                ((QList<QString> *)in_stack_fffffffffffffbf0,
                 (parameter_type)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    }
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    qEnvironmentVariable((char *)&local_a0);
    bVar1 = QString::isEmpty((QString *)0xadf055);
    if (!bVar1) {
      QChar::QChar<char16_t,_true>(&local_ba,L':');
      QFlags<Qt::SplitBehaviorFlags>::QFlags
                ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_fffffffffffffbf0,
                 in_stack_fffffffffffffbec);
      QString::split((QChar)(char16_t)local_b8,(QFlags_conflict *)&local_a0,
                     (uint)(ushort)local_ba.ucs);
      QList<QString>::operator+=
                ((QList<QString> *)in_stack_fffffffffffffbf0,
                 (QList<QString> *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      QList<QString>::~QList((QList<QString> *)0xadf0cc);
    }
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    local_d0 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    QDir::homePath();
    local_160 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffbf8,(size_t)in_stack_fffffffffffffbf0);
    ::operator+(&in_stack_fffffffffffffbf8->a,&in_stack_fffffffffffffbf0->a);
    QLatin1String::QLatin1String
              ((QLatin1String *)
               CONCAT17(in_stack_fffffffffffffc07,
                        CONCAT16(in_stack_fffffffffffffc06,
                                 CONCAT15(in_stack_fffffffffffffc05,
                                          CONCAT14(in_stack_fffffffffffffc04,
                                                   in_stack_fffffffffffffc00)))),
               (QByteArray *)in_stack_fffffffffffffbf8);
    ::operator+(in_stack_fffffffffffffbf8,&in_stack_fffffffffffffbf0->a);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String> *)
               CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String> *)0xadf198);
    QStringBuilder<QString,_QLatin1String>::~QStringBuilder
              ((QStringBuilder<QString,_QLatin1String> *)0xadf1a5);
    QString::~QString((QString *)0xadf1b2);
    QFileInfo::QFileInfo(local_178,(QString *)&local_d8);
    bVar2 = QFileInfo::isDir();
    QFileInfo::~QFileInfo(local_178);
    if ((bVar2 & 1) != 0) {
      QList<QString>::operator+=
                ((QList<QString> *)in_stack_fffffffffffffbf0,
                 (parameter_type)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    }
    local_190 = &DAT_aaaaaaaaaaaaaaaa;
    local_188 = &DAT_aaaaaaaaaaaaaaaa;
    local_180 = &DAT_aaaaaaaaaaaaaaaa;
    QDir::homePath();
    local_1e0 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffbf8,(size_t)in_stack_fffffffffffffbf0);
    ::operator+(&in_stack_fffffffffffffbf8->a,&in_stack_fffffffffffffbf0->a);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString,_QLatin1String> *)
               CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    QStringBuilder<QString,_QLatin1String>::~QStringBuilder
              ((QStringBuilder<QString,_QLatin1String> *)0xadf29e);
    QString::~QString((QString *)0xadf2ab);
    QFileInfo::QFileInfo(local_1e8,(QString *)&local_190);
    bVar3 = QFileInfo::isDir();
    QFileInfo::~QFileInfo(local_1e8);
    if ((bVar3 & 1) != 0) {
      QList<QString>::operator+=
                ((QList<QString> *)in_stack_fffffffffffffbf0,
                 (parameter_type)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    }
    local_200 = &DAT_aaaaaaaaaaaaaaaa;
    local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_260 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffbf8,(size_t)in_stack_fffffffffffffbf0);
    QLatin1String::QLatin1String
              ((QLatin1String *)
               CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(in_stack_fffffffffffffc05,
                                                      CONCAT14(in_stack_fffffffffffffc04,
                                                               in_stack_fffffffffffffc00)))),
               (QByteArray *)in_stack_fffffffffffffbf8);
    ::operator+(&in_stack_fffffffffffffbf0->a,
                (QLatin1String *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    local_280 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffbf8,(size_t)in_stack_fffffffffffffbf0);
    ::operator+(in_stack_fffffffffffffbf0,
                (QLatin1String *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_QLatin1String> *)
               CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    QFileInfo::QFileInfo(local_288,(QString *)&local_200);
    bVar4 = QFileInfo::isReadable();
    QFileInfo::~QFileInfo(local_288);
    if ((bVar4 & 1) != 0) {
      local_298 = &DAT_aaaaaaaaaaaaaaaa;
      local_290 = &DAT_aaaaaaaaaaaaaaaa;
      QSettings::QSettings((QSettings *)&local_298,(QString *)&local_200,IniFormat,(QObject *)0x0);
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (local_2d8,(Data *)0x0,L"Directories-default",0x13);
      QString::QString((QString *)in_stack_fffffffffffffbf0,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
      ;
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)
                 CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(bVar4,CONCAT14(in_stack_fffffffffffffc04,
                                                                       in_stack_fffffffffffffc00))))
                 ,&in_stack_fffffffffffffbf8->a);
      QSettings::beginGroup((QAnyStringView *)&local_298);
      QString::~QString((QString *)0xadf4de);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffbf0);
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_330,(Data *)0x0,L"prefixes",8);
      QString::QString((QString *)in_stack_fffffffffffffbf0,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
      ;
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)
                 CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(bVar4,CONCAT14(in_stack_fffffffffffffc04,
                                                                       in_stack_fffffffffffffc00))))
                 ,&in_stack_fffffffffffffbf8->a);
      QSettings::value((QAnyStringView *)&local_28);
      ::QVariant::toStringList();
      QList<QString>::operator+=
                ((QList<QString> *)in_stack_fffffffffffffbf0,
                 (QList<QString> *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      QList<QString>::~QList((QList<QString> *)0xadf5af);
      ::QVariant::~QVariant(&local_28);
      QString::~QString((QString *)0xadf5c9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffbf0);
      QSettings::~QSettings((QSettings *)&local_298);
    }
    local_348 = &DAT_aaaaaaaaaaaaaaaa;
    local_340 = &DAT_aaaaaaaaaaaaaaaa;
    local_338 = &DAT_aaaaaaaaaaaaaaaa;
    local_378 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffbf8,(size_t)in_stack_fffffffffffffbf0);
    QLatin1String::QLatin1String
              ((QLatin1String *)
               CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(bVar4,CONCAT14(in_stack_fffffffffffffc04,
                                                                     in_stack_fffffffffffffc00)))),
               (QByteArray *)in_stack_fffffffffffffbf8);
    ::operator+(&in_stack_fffffffffffffbf0->a,
                (QLatin1String *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QLatin1String,_QLatin1String> *)
               CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    QFileInfo::QFileInfo(local_390,(QString *)&local_348);
    bVar5 = QFileInfo::isDir();
    QFileInfo::~QFileInfo(local_390);
    if ((bVar5 & 1) != 0) {
      QList<QString>::operator+=
                ((QList<QString> *)in_stack_fffffffffffffbf0,
                 (parameter_type)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    }
    iVar6 = (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
    QListSpecialMethods<QString>::removeDuplicates((QListSpecialMethods<QString> *)0xadf6d7);
    bVar1 = QList<QString>::isEmpty((QList<QString> *)0xadf6e4);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)
                 CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(bVar4,CONCAT14(bVar5,
                                                  in_stack_fffffffffffffc00)))),
                 (char *)in_stack_fffffffffffffbf8,iVar6,
                 (char *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      QMessageLogger::warning(local_3b0,"Unable to determine KDE dirs");
      local_3e8 = (QPlatformTheme *)0x0;
    }
    else {
      local_3e8 = (QPlatformTheme *)operator_new(0x10);
      QKdeTheme((QKdeTheme *)
                CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(bVar4,CONCAT14(bVar5,
                                                  in_stack_fffffffffffffc00)))),
                (QStringList *)local_3e8,iVar6);
    }
    QString::~QString((QString *)0xadf765);
    QString::~QString((QString *)0xadf772);
    QString::~QString((QString *)0xadf77f);
    QString::~QString((QString *)0xadf78c);
    QString::~QString((QString *)0xadf799);
    QString::~QString((QString *)0xadf7a6);
    QList<QString>::~QList((QList<QString> *)0xadf7b3);
  }
  else {
    local_3e8 = (QPlatformTheme *)operator_new(0x10);
    iVar6 = (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
    QStandardPaths::standardLocations((StandardLocation)local_58);
    QKdeTheme((QKdeTheme *)
              CONCAT17(in_stack_fffffffffffffc07,
                       CONCAT16(in_stack_fffffffffffffc06,
                                CONCAT15(in_stack_fffffffffffffc05,
                                         CONCAT14(in_stack_fffffffffffffc04,
                                                  in_stack_fffffffffffffc00)))),
              (QStringList *)in_stack_fffffffffffffbf8,iVar6);
    QList<QString>::~QList((QList<QString> *)0xadef59);
  }
  QByteArray::~QByteArray((QByteArray *)0xadf7c0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_3e8;
}

Assistant:

QPlatformTheme *QKdeTheme::createKdeTheme()
{
    const QByteArray kdeVersionBA = qgetenv("KDE_SESSION_VERSION");
    const int kdeVersion = kdeVersionBA.toInt();
    if (kdeVersion < 4)
        return nullptr;

    if (kdeVersion > 4)
        // Plasma 5 follows XDG spec
        // but uses the same config file format:
        return new QKdeTheme(QStandardPaths::standardLocations(QStandardPaths::GenericConfigLocation), kdeVersion);

    // Determine KDE prefixes in the following priority order:
    // - KDEHOME and KDEDIRS environment variables
    // - ~/.kde(<version>)
    // - read prefixes from /etc/kde<version>rc
    // - fallback to /etc/kde<version>

    QStringList kdeDirs;
    const QString kdeHomePathVar = qEnvironmentVariable("KDEHOME");
    if (!kdeHomePathVar.isEmpty())
        kdeDirs += kdeHomePathVar;

    const QString kdeDirsVar = qEnvironmentVariable("KDEDIRS");
    if (!kdeDirsVar.isEmpty())
        kdeDirs += kdeDirsVar.split(u':', Qt::SkipEmptyParts);

    const QString kdeVersionHomePath = QDir::homePath() + "/.kde"_L1 + QLatin1StringView(kdeVersionBA);
    if (QFileInfo(kdeVersionHomePath).isDir())
        kdeDirs += kdeVersionHomePath;

    const QString kdeHomePath = QDir::homePath() + "/.kde"_L1;
    if (QFileInfo(kdeHomePath).isDir())
        kdeDirs += kdeHomePath;

    const QString kdeRcPath = "/etc/kde"_L1 + QLatin1StringView(kdeVersionBA) + "rc"_L1;
    if (QFileInfo(kdeRcPath).isReadable()) {
        QSettings kdeSettings(kdeRcPath, QSettings::IniFormat);
        kdeSettings.beginGroup(QStringLiteral("Directories-default"));
        kdeDirs += kdeSettings.value(QStringLiteral("prefixes")).toStringList();
    }

    const QString kdeVersionPrefix = "/etc/kde"_L1 + QLatin1StringView(kdeVersionBA);
    if (QFileInfo(kdeVersionPrefix).isDir())
        kdeDirs += kdeVersionPrefix;

    kdeDirs.removeDuplicates();
    if (kdeDirs.isEmpty()) {
        qWarning("Unable to determine KDE dirs");
        return nullptr;
    }

    return new QKdeTheme(kdeDirs, kdeVersion);
}